

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O0

axl_va_list * __thiscall
axl::sl::PackStringBase<char>::operator()
          (PackStringBase<char> *this,void *p,size_t *size,axl_va_list *va)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  axl_va_list *in_RDI;
  axl_va_list *in_R8;
  size_t stringSize;
  size_t length;
  char *string;
  axl_va_list *src;
  
  src = in_RDI;
  pcVar1 = axl_va_list::arg<char*>(in_R8);
  sVar2 = StringDetailsBase<char>::calcLength((C *)in_RDI);
  *in_RCX = (void *)(sVar2 + 1);
  if (in_RDX != (undefined8 *)0x0) {
    if (pcVar1 == (char *)0x0) {
      *in_RDX = 0;
    }
    else {
      __wrap_memcpy((void *)(sVar2 + 1),src,(size_t)in_RDI);
    }
  }
  axl_va_list::axl_va_list(in_RDI,in_R8);
  return src;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		T* string = va.arg<T*> ();

		size_t length = StringDetailsBase<T>::calcLength(string);
		size_t stringSize = (length + 1) * sizeof(T);

		*size = stringSize;

		if (p) {
			if (string)
				memcpy(p, string, stringSize);
			else
				*(T**)p = NULL;
		}

		return va;
	}